

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FractCase::compare(FractCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  float fVar2;
  int numAccurateBits;
  pointer pSVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  char *pcVar9;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar10;
  ulong uVar11;
  deUint32 u32;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  deUint32 u32_1;
  HexFloat local_38;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    uVar10 = 0;
    uVar11 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar11 = uVar10;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      fVar15 = *(float *)((long)*inputs + uVar10 * 4);
      fVar12 = floorf(fVar15);
      fVar2 = *(float *)((long)*outputs + uVar10 * 4);
      fVar15 = fVar15 - fVar12;
      if (PVar1 == PRECISION_HIGHP) {
        dVar5 = (int)fVar15 - (int)fVar2;
        if ((uint)fVar15 < (uint)fVar2) {
          dVar5 = -((int)fVar15 - (int)fVar2);
        }
      }
      else {
        dVar5 = getUlpDiffIgnoreZeroSign(fVar2,fVar15);
      }
      if (dVar5 != 0) {
        poVar7 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar10);
        poVar7 = std::operator<<(poVar7,"] = ");
        local_34.value = fVar15;
        poVar7 = Functional::operator<<(poVar7,&local_34);
        pcVar9 = ", got ULP diff ";
LAB_00474e40:
        poVar7 = std::operator<<(poVar7,pcVar9);
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ = dVar5;
        tcu::Format::operator<<(poVar7,hex_00);
        return false;
      }
    }
  }
  else {
    numAccurateBits = *(int *)(&DAT_00817b9c + (ulong)PVar1 * 4);
    fVar15 = getEpsFromBits(1.0,numAccurateBits);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      fVar2 = *(float *)((long)*inputs + uVar11 * 4);
      fVar12 = *(float *)((long)*outputs + uVar11 * 4);
      fVar13 = floorf(fVar2 - fVar15);
      fVar14 = floorf(fVar15 + fVar2);
      if ((int)fVar13 == (int)fVar14) {
        fVar13 = floorf(fVar2);
        fVar13 = fVar2 - fVar13;
        iVar6 = numBitsLostInOp(fVar2,fVar13);
        iVar6 = numAccurateBits - iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        uVar8 = ~(-1 << (0x17U - (char)iVar6 & 0x1f));
        dVar5 = getUlpDiffIgnoreZeroSign(fVar12,fVar13);
        if (uVar8 < dVar5) {
          poVar7 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,
                                   "Expected [");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar11);
          poVar7 = std::operator<<(poVar7,"] = ");
          local_38.value = fVar13;
          poVar7 = Functional::operator<<(poVar7,&local_38);
          poVar7 = std::operator<<(poVar7," with ULP threshold ");
          hex.value._4_4_ = 0;
          hex.value._0_4_ = uVar8;
          poVar7 = tcu::Format::operator<<(poVar7,hex);
          pcVar9 = ", got diff ";
          goto LAB_00474e40;
        }
      }
      else if (1.0 <= fVar12) {
        poVar7 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar11);
        std::operator<<(poVar7,"] < 1.0");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFrac(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (int(deFloatFloor(in0-eps)) == int(deFloatFloor(in0+eps)))
				{
					const float		ref			= deFloatFrac(in0);
					const int		bitsLost	= numBitsLostInOp(in0, ref);
					const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(0, mantissaBits-bitsLost));	// ULP diff for rounded integer value.
					const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > maxUlpDiff)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << " with ULP threshold " << tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
				else
				{
					if (out0 >= 1.0f)
					{
						m_failMsg << "Expected [" << compNdx << "] < 1.0";
						return false;
					}
				}
			}
		}

		return true;
	}